

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitRefAs
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefAs *curr)

{
  int iVar1;
  bool bVar2;
  Literal local_c8;
  Literal local_b0;
  Literal local_98;
  Literal *local_80;
  Literal *value;
  undefined1 local_68 [8];
  Flow flow;
  RefAs *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  visit((Flow *)local_68,this,*(Expression **)(curr + 0x18));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    local_80 = Flow::getSingleValue((Flow *)local_68);
    iVar1 = *(int *)(flow.breakTo.super_IString.str._M_str + 0x10);
    if (iVar1 == 0) {
      bVar2 = wasm::Literal::isNull(local_80);
      if (bVar2) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      ::wasm::Literal::Literal(&local_98,local_80);
      Flow::Flow(__return_storage_ptr__,&local_98);
      ::wasm::Literal::~Literal(&local_98);
    }
    else if (iVar1 == 1) {
      ::wasm::Literal::internalize();
      Flow::Flow(__return_storage_ptr__,&local_b0);
      ::wasm::Literal::~Literal(&local_b0);
    }
    else {
      if (iVar1 != 2) {
        ::wasm::handle_unreachable
                  ("unimplemented ref.as_*",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                   ,0x72c);
      }
      ::wasm::Literal::externalize();
      Flow::Flow(__return_storage_ptr__,&local_c8);
      ::wasm::Literal::~Literal(&local_c8);
    }
  }
  value._0_4_ = 1;
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefAs(RefAs* curr) {
    NOTE_ENTER("RefAs");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    const auto& value = flow.getSingleValue();
    NOTE_EVAL1(value);
    switch (curr->op) {
      case RefAsNonNull:
        if (value.isNull()) {
          trap("null ref");
        }
        return value;
      case ExternInternalize:
        return value.internalize();
      case ExternExternalize:
        return value.externalize();
    }
    WASM_UNREACHABLE("unimplemented ref.as_*");
  }